

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  pointer pHVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Header *pHVar6;
  pointer pSVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  size_t sVar10;
  char *pcVar11;
  invalid_argument *this;
  code *check;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  pointer pSVar15;
  uint uVar16;
  int part;
  DeepTiledInputPart inPart;
  SetAttrVector attrs;
  int i;
  MultiPartInputFile in;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  MultiPartOutputFile out;
  DeepTiledOutputPart outPart;
  int local_e4;
  DeepTiledInputPart local_e0 [8];
  SetAttrVector local_d8;
  char **local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  MultiPartInputFile local_98 [16];
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_88;
  Header local_70 [56];
  DeepTiledOutputPart local_38 [8];
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    return 1;
  }
  local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e4 = -1;
  local_ac = 1;
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_b8 = argv;
  do {
    iVar4 = local_ac;
    pcVar11 = argv[local_ac];
    pcVar14 = pcVar11;
    iVar3 = strcmp(pcVar11,"-part");
    if (iVar3 == 0) {
      getPart(pcVar14,argc,argv,&local_ac,&local_e4);
    }
    else {
      pcVar14 = pcVar11 + 1;
      iVar3 = strcmp(pcVar11,"-chromaticities");
      if (iVar3 == 0) {
        getChromaticities(pcVar14,argc,argv,&local_ac,local_e4,&local_d8);
      }
      else {
        iVar3 = strcmp(pcVar11,"-whiteLuminance");
        if (iVar3 == 0) {
LAB_00105904:
          getFloat(pcVar14,argc,argv,&local_ac,local_e4,&local_d8,(_func_void_char_ptr_float *)0x0);
        }
        else {
          iVar3 = strcmp(pcVar11,"-adoptedNeutral");
          if (iVar3 == 0) {
LAB_0010594c:
            getV2f(pcVar14,argc,argv,&local_ac,local_e4,&local_d8,(_func_void_char_ptr_V2f_ptr *)0x0
                  );
          }
          else {
            iVar3 = strcmp(pcVar11,"-renderingTransform");
            if ((iVar3 != 0) && (iVar3 = strcmp(pcVar11,"-lookModTransform"), iVar3 != 0)) {
              iVar3 = strcmp(pcVar11,"-xDensity");
              check = isPositive;
              if (iVar3 == 0) goto LAB_00105970;
              iVar3 = strcmp(pcVar11,"-owner");
              if ((iVar3 != 0) && (iVar3 = strcmp(pcVar11,"-comments"), iVar3 != 0)) {
                iVar3 = strcmp(pcVar11,"-capDate");
                if (iVar3 == 0) {
                  getString(pcVar14,argc,argv,&local_ac,local_e4,&local_d8,isDate);
                }
                else {
                  iVar3 = strcmp(pcVar11,"-utcOffset");
                  if ((((iVar3 == 0) || (iVar3 = strcmp(pcVar11,"-longitude"), iVar3 == 0)) ||
                      (iVar3 = strcmp(pcVar11,"-latitude"), iVar3 == 0)) ||
                     (iVar3 = strcmp(pcVar11,"-altitude"), iVar3 == 0)) goto LAB_00105904;
                  iVar3 = strcmp(pcVar11,"-focus");
                  if (iVar3 == 0) {
                    getPosFloatOrInf(pcVar14,argc,argv,&local_ac,local_e4,&local_d8);
                  }
                  else {
                    iVar3 = strcmp(pcVar11,"-expTime");
                    check = isPositive;
                    if (iVar3 != 0) {
                      iVar3 = strcmp(pcVar11,"-aperture");
                      check = isPositive;
                      if (iVar3 != 0) {
                        iVar3 = strcmp(pcVar11,"-isoSpeed");
                        check = isPositive;
                        if (iVar3 != 0) {
                          iVar3 = strcmp(pcVar11,"-envmap");
                          if (iVar3 == 0) {
                            getEnvmap(pcVar14,argc,argv,&local_ac,local_e4,&local_d8);
                          }
                          else {
                            iVar3 = strcmp(pcVar11,"-framesPerSecond");
                            if (iVar3 == 0) {
                              getRational(pcVar14,argc,argv,&local_ac,local_e4,&local_d8,
                                          (_func_void_char_ptr_Rational_ptr *)0x0);
                            }
                            else {
                              iVar3 = strcmp(pcVar11,"-keyCode");
                              if (iVar3 == 0) {
                                getKeyCode(pcVar14,argc,argv,&local_ac,local_e4,&local_d8);
                              }
                              else {
                                iVar3 = strcmp(pcVar11,"-timeCode");
                                if (iVar3 != 0) {
                                  iVar3 = strcmp(pcVar11,"-wrapmodes");
                                  if (iVar3 == 0) goto LAB_00105928;
                                  iVar3 = strcmp(pcVar11,"-pixelAspectRatio");
                                  check = isPositive;
                                  if (iVar3 != 0) {
                                    iVar3 = strcmp(pcVar11,"-screenWindowWidth");
                                    check = isNonNegative;
                                    if (iVar3 != 0) {
                                      iVar3 = strcmp(pcVar11,"-screenWindowCenter");
                                      if (iVar3 == 0) goto LAB_0010594c;
                                      iVar3 = strcmp(pcVar11,"-string");
                                      argv = local_b8;
                                      if (iVar3 == 0) {
                                        getNameAndString(argc,local_b8,&local_ac,local_e4,&local_d8)
                                        ;
                                      }
                                      else {
                                        iVar3 = strcmp(pcVar11,"-float");
                                        argv = local_b8;
                                        if (iVar3 == 0) {
                                          getNameAndFloat(argc,local_b8,&local_ac,local_e4,&local_d8
                                                         );
                                        }
                                        else {
                                          iVar3 = strcmp(pcVar11,"-int");
                                          argv = local_b8;
                                          if (iVar3 == 0) {
                                            getNameAndInt(argc,local_b8,&local_ac,local_e4,&local_d8
                                                         );
                                          }
                                          else {
                                            if ((((*pcVar11 == '-') && (*pcVar14 == 'h')) &&
                                                (pcVar11[2] == '\0')) ||
                                               (iVar3 = strcmp(pcVar11,"--help"), iVar3 == 0)) {
                                              usageMessage((ostream *)&std::cout,"exrstdattr",true);
LAB_00106002:
                                              std::vector<SetAttr,_std::allocator<SetAttr>_>::
                                              ~vector(&local_d8);
                                              return 0;
                                            }
                                            iVar3 = strcmp(pcVar11,"--version");
                                            if (iVar3 == 0) {
                                              pcVar11 = (char *)Imf_3_2::getLibraryVersion();
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         "exrstdattr (OpenEXR) ",0x15);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"3.2.0",5);
                                              iVar4 = strcmp(pcVar11,"3.2.0");
                                              if (iVar4 != 0) {
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,"(OpenEXR version "
                                                           ,0x11);
                                                poVar9 = std::operator<<((ostream *)&std::cout,
                                                                         pcVar11);
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          (poVar9,")",1);
                                              }
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         " https://openexr.com",0x14);
                                              std::endl<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                                                                                  
                                                  "Copyright (c) Contributors to the OpenEXR Project"
                                                  ,0x31);
                                              std::endl<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         "License BSD-3-Clause",0x14);
                                              std::endl<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout);
                                              goto LAB_00106002;
                                            }
                                            if (local_a0 == (char *)0x0) {
                                              local_a0 = pcVar11;
                                              pcVar11 = local_a8;
                                            }
                                            local_a8 = pcVar11;
                                            local_ac = iVar4 + 1;
                                            argv = local_b8;
                                          }
                                        }
                                      }
                                      goto LAB_0010598e;
                                    }
                                  }
                                  goto LAB_00105970;
                                }
                                getTimeCode(pcVar14,argc,argv,&local_ac,local_e4,&local_d8);
                              }
                            }
                          }
                          goto LAB_0010598e;
                        }
                      }
                    }
LAB_00105970:
                    getFloat(pcVar14,argc,argv,&local_ac,local_e4,&local_d8,check);
                  }
                }
                goto LAB_0010598e;
              }
            }
LAB_00105928:
            getString(pcVar14,argc,argv,&local_ac,local_e4,&local_d8,
                      (_func_void_char_ptr_char_ptr *)0x0);
          }
        }
      }
    }
LAB_0010598e:
    pcVar11 = local_a0;
    if (argc <= local_ac) {
      if (local_a0 == (char *)0x0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Missing input filename");
      }
      else if (local_a8 == (char *)0x0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Missing input filename");
      }
      else {
        iVar4 = strcmp(local_a0,local_a8);
        if (iVar4 != 0) {
          iVar4 = Imf_3_2::globalThreadCount();
          Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_98,pcVar11,iVar4,true);
          uVar5 = Imf_3_2::MultiPartInputFile::parts();
          local_88.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_start = (Header *)0x0;
          local_88.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar16 = 0;
          if (0 < (int)uVar5) {
            do {
              pHVar6 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_98);
              Imf_3_2::Header::Header(local_70,pHVar6);
              if (local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                lVar12 = 0;
                uVar13 = 0;
                pSVar7 = local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                pSVar15 = local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  uVar1 = *(uint *)((long)&pSVar15->part + lVar12);
                  if (uVar1 == 0xffffffff || uVar1 == uVar16) {
                    Imf_3_2::Header::insert
                              ((string *)local_70,
                               (Attribute *)((long)&(pSVar15->name)._M_dataplus._M_p + lVar12));
                    pSVar7 = local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    pSVar15 = local_d8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl
                              .super__Vector_impl_data._M_start;
                  }
                  else if (uVar5 <= uVar1) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Invalid part number ",0x14);
                    poVar9 = (ostream *)
                             std::ostream::operator<<
                                       ((ostream *)&std::cerr,
                                        *(int *)((long)&pSVar15->part + lVar12));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar9,". Part numbers in file ",0x17);
                    pcVar11 = local_a0;
                    sVar10 = strlen(local_a0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar11,sVar10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9," go from 0 to ",0xe);
                    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar5 - 1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    Imf_3_2::Header::~Header(local_70);
                    iVar4 = 1;
                    goto LAB_00105ec1;
                  }
                  uVar13 = uVar13 + 1;
                  lVar12 = lVar12 + 0x30;
                } while (uVar13 < (ulong)(((long)pSVar7 - (long)pSVar15 >> 4) * -0x5555555555555555)
                        );
              }
              std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                        (&local_88,local_70);
              Imf_3_2::Header::~Header(local_70);
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar5);
          }
          pHVar2 = local_88.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar4 = Imf_3_2::globalThreadCount();
          Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                    ((MultiPartOutputFile *)local_70,local_a8,pHVar2,uVar5,false,iVar4);
          if (0 < (int)uVar5) {
            uVar16 = 0;
            do {
              Imf_3_2::MultiPartInputFile::header((int)local_98);
              puVar8 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
              sVar10 = puVar8[1];
              if ((sVar10 == _DAT_0010b2e0) &&
                 ((sVar10 == 0 ||
                  (iVar4 = bcmp((void *)*puVar8,Imf_3_2::SCANLINEIMAGE_abi_cxx11_,sVar10),
                  iVar4 == 0)))) {
                Imf_3_2::InputPart::InputPart((InputPart *)local_e0,local_98,uVar16);
                Imf_3_2::OutputPart::OutputPart
                          ((OutputPart *)local_38,(MultiPartOutputFile *)local_70,uVar16);
                Imf_3_2::OutputPart::copyPixels((InputPart *)local_38);
              }
              else if ((sVar10 == DAT_0010b300) &&
                      ((sVar10 == 0 ||
                       (iVar4 = bcmp((void *)*puVar8,Imf_3_2::TILEDIMAGE_abi_cxx11_,sVar10),
                       iVar4 == 0)))) {
                Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)local_e0,local_98,uVar16);
                Imf_3_2::TiledOutputPart::TiledOutputPart
                          ((TiledOutputPart *)local_38,(MultiPartOutputFile *)local_70,uVar16);
                Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)local_38);
              }
              else if ((sVar10 == DAT_0010b320) &&
                      ((sVar10 == 0 ||
                       (iVar4 = bcmp((void *)*puVar8,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar10),
                       iVar4 == 0)))) {
                Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                          ((DeepScanLineInputPart *)local_e0,local_98,uVar16);
                Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                          ((DeepScanLineOutputPart *)local_38,(MultiPartOutputFile *)local_70,uVar16
                          );
                Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)local_38);
              }
              else if ((sVar10 == DAT_0010b340) &&
                      ((sVar10 == 0 ||
                       (iVar4 = bcmp((void *)*puVar8,Imf_3_2::DEEPTILE_abi_cxx11_,sVar10),
                       iVar4 == 0)))) {
                Imf_3_2::DeepTiledInputPart::DeepTiledInputPart(local_e0,local_98,uVar16);
                Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                          (local_38,(MultiPartOutputFile *)local_70,uVar16);
                Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)local_38);
              }
              uVar16 = uVar16 + 1;
            } while (uVar5 != uVar16);
          }
          Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_70);
          iVar4 = 0;
LAB_00105ec1:
          std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_88);
          Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_98);
          std::vector<SetAttr,_std::allocator<SetAttr>_>::~vector(&local_d8);
          return iVar4;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Input and output cannot be the same file");
      }
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  } while( true );
}

Assistant:

int
main (int argc, char** argv)
{
    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    try
    {
        const char* inFileName  = 0;
        const char* outFileName = 0;

        SetAttrVector attrs;
        int           part = -1;
        int           i    = 1;

        while (i < argc)
        {
            const char* attrName = argv[i] + 1;

            if (!strcmp (argv[i], "-part"))
            {
                getPart (attrName, argc, argv, i, part);
            }
            else if (!strcmp (argv[i], "-chromaticities"))
            {
                getChromaticities (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-whiteLuminance"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-adoptedNeutral"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-renderingTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-lookModTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-xDensity"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-owner"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-comments"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-capDate"))
            {
                getString (attrName, argc, argv, i, part, attrs, isDate);
            }
            else if (!strcmp (argv[i], "-utcOffset"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-longitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-latitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-altitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-focus"))
            {
                getPosFloatOrInf (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-expTime"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-aperture"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-isoSpeed"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-envmap"))
            {
                getEnvmap (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-framesPerSecond"))
            {
                getRational (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-keyCode"))
            {
                getKeyCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-timeCode"))
            {
                getTimeCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-wrapmodes"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-pixelAspectRatio"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-screenWindowWidth"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isNonNegative);
            }
            else if (!strcmp (argv[i], "-screenWindowCenter"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-string"))
            {
                getNameAndString (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-float"))
            {
                getNameAndFloat (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-int"))
            {
                getNameAndInt (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                usageMessage (cout, "exrstdattr", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion();
            
                cout << "exrstdattr (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
                cout << "License BSD-3-Clause" << endl;

                return 0;
            }
            else
            {
                if (inFileName == 0)
                    inFileName = argv[i];
                else
                    outFileName = argv[i];

                i += 1;
            }
        }

        if (inFileName == 0)
            throw invalid_argument("Missing input filename");
        if (outFileName == 0)
            throw invalid_argument("Missing input filename");

        if (!strcmp (inFileName, outFileName))
            throw invalid_argument("Input and output cannot be the same file");

        //
        // Load the headers from the input file
        // and add attributes to the headers.
        //

        MultiPartInputFile in (inFileName);
        int                numParts = in.parts ();
        vector<Header>     headers;

        for (int part = 0; part < numParts; ++part)
        {
            Header h = in.header (part);

            for (size_t i = 0; i < attrs.size (); ++i)
            {
                const SetAttr& attr = attrs[i];

                if (attr.part == -1 || attr.part == part)
                {
                    h.insert (attr.name, *attr.attr);
                }
                else if (attr.part < 0 || attr.part >= numParts)
                {
                    cerr << "Invalid part number " << attr.part
                         << ". "
                            "Part numbers in file "
                         << inFileName
                         << " "
                            "go from 0 to "
                         << numParts - 1 << "." << endl;

                    return 1;
                }
            }

            headers.push_back (h);
        }

        //
        // Crete an output file with the modified headers,
        // and copy the pixels from the input file to the
        // output file.
        //

        MultiPartOutputFile out (outFileName, &headers[0], numParts);

        for (int p = 0; p < numParts; ++p)
        {
            const Header& h    = in.header (p);
            const string& type = h.type ();

            if (type == SCANLINEIMAGE)
            {
                InputPart  inPart (in, p);
                OutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == TILEDIMAGE)
            {
                TiledInputPart  inPart (in, p);
                TiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  inPart (in, p);
                DeepScanLineOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  inPart (in, p);
                DeepTiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
        }
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}